

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O0

bool InfoListWnd::ToggleDisplay(int _force)

{
  bool bVar1;
  InfoListWnd *pIVar2;
  int in_EDI;
  WndMode in_stack_000000fc;
  InfoListWnd *in_stack_00000100;
  int local_8;
  bool local_1;
  
  local_8 = in_EDI;
  if (in_EDI == 0) {
    bVar1 = IsDisplayed();
    local_8 = 1;
    if (bVar1) {
      local_8 = -1;
    }
  }
  if (local_8 < 1) {
    if ((gpILW != (InfoListWnd *)0x0) && (gpILW != (InfoListWnd *)0x0)) {
      (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
    }
    local_1 = false;
  }
  else {
    if (gpILW == (InfoListWnd *)0x0) {
      pIVar2 = (InfoListWnd *)operator_new(0x300);
      InfoListWnd(in_stack_00000100,in_stack_000000fc);
      gpILW = pIVar2;
    }
    (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpILW,1);
    ImgWindow::BringWindowToFront((ImgWindow *)0x174c07);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool InfoListWnd::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = InfoListWnd::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpILW)
            gpILW = new InfoListWnd();
        // Ensure it is visible
        gpILW->SetVisible(true);
        gpILW->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpILW)                      // just remove the object
            delete gpILW;               // (destructor clears gpILW)
        return false;                   // not visible
    }
}